

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.h
# Opt level: O2

void __thiscall embree::QuadMesh::interpolate_impl<4>(QuadMesh *this,RTCInterpolateArguments *args)

{
  uint *puVar1;
  uint *puVar2;
  float *pfVar3;
  float *pfVar4;
  uint *puVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  BufferView<embree::Vec3fa> *pBVar15;
  char *pcVar16;
  long lVar17;
  bool bVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  float fVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  
  uVar7 = args->primID;
  fVar25 = args->v;
  fVar26 = (float)args->bufferType;
  pfVar9 = args->P;
  pfVar10 = args->dPdu;
  pfVar11 = args->dPdv;
  pfVar12 = args->ddPdudu;
  pfVar13 = args->ddPdvdv;
  pfVar14 = args->ddPdudv;
  uVar8 = args->valueCount;
  pBVar15 = (&this->vertices)[args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE].items;
  pcVar16 = pBVar15[args->bufferSlot].super_RawBufferView.ptr_ofs;
  uVar29 = (ulong)(uint)pBVar15[args->bufferSlot].super_RawBufferView.stride;
  uVar31 = 0;
  bVar18 = fVar25 + fVar26 <= 1.0;
  uVar30 = 0xe;
  if (!bVar18) {
    uVar30 = 0;
  }
  uVar28 = (ulong)((bVar18 | uVar30) << 4);
  fVar32 = 1.0 - fVar25;
  for (; uVar31 < uVar8; uVar31 = uVar31 + 4) {
    lVar17 = *(long *)&(this->super_Geometry).field_0x58;
    lVar27 = *(long *)&this->field_0x68 * (ulong)uVar7;
    uVar30 = (uint)uVar31;
    uVar37 = -(uint)((int)uVar30 < (int)uVar8);
    uVar38 = -(uint)((int)(uVar30 | 1) < (int)uVar8);
    uVar39 = -(uint)((int)(uVar30 | 2) < (int)uVar8);
    uVar40 = -(uint)((int)(uVar30 | 3) < (int)uVar8);
    puVar5 = (uint *)(pcVar16 + uVar31 * 4 + *(uint *)(lVar17 + lVar27) * uVar29);
    puVar6 = (uint *)(pcVar16 + uVar31 * 4 + *(uint *)(lVar17 + 4 + lVar27) * uVar29);
    puVar1 = (uint *)(pcVar16 + uVar31 * 4 + *(uint *)(lVar17 + 8 + lVar27) * uVar29);
    puVar2 = (uint *)(pcVar16 + uVar31 * 4 + *(uint *)(lVar17 + 0xc + lVar27) * uVar29);
    uVar30 = *(uint *)(mm_lookupmask_ps + uVar28);
    uVar19 = *(uint *)(mm_lookupmask_ps + uVar28 + 4);
    uVar20 = *(uint *)(mm_lookupmask_ps + uVar28 + 8);
    uVar21 = *(uint *)(mm_lookupmask_ps + uVar28 + 0xc);
    uVar33 = uVar30 ^ 0xffffffff;
    uVar34 = uVar19 ^ 0xffffffff;
    uVar35 = uVar20 ^ 0xffffffff;
    uVar36 = uVar21 ^ 0xffffffff;
    fVar41 = (float)(~uVar30 & *puVar1 & uVar37 | uVar30 & uVar37 & *puVar5);
    fVar42 = (float)(~uVar19 & puVar1[1] & uVar38 | uVar19 & uVar38 & puVar5[1]);
    fVar43 = (float)(~uVar20 & puVar1[2] & uVar39 | uVar20 & uVar39 & puVar5[2]);
    fVar44 = (float)(~uVar21 & puVar1[3] & uVar40 | uVar21 & uVar40 & puVar5[3]);
    fVar53 = (float)(~uVar30 & *puVar2 & uVar37 | uVar30 & *puVar6 & uVar37);
    fVar54 = (float)(~uVar19 & puVar2[1] & uVar38 | uVar19 & puVar6[1] & uVar38);
    fVar55 = (float)(~uVar20 & puVar2[2] & uVar39 | uVar20 & puVar6[2] & uVar39);
    fVar56 = (float)(~uVar21 & puVar2[3] & uVar40 | uVar21 & puVar6[3] & uVar40);
    fVar49 = (float)(~uVar30 & *puVar6 & uVar37 | *puVar2 & uVar37 & uVar30);
    fVar50 = (float)(~uVar19 & puVar6[1] & uVar38 | puVar2[1] & uVar38 & uVar19);
    fVar51 = (float)(~uVar20 & puVar6[2] & uVar39 | puVar2[2] & uVar39 & uVar20);
    fVar52 = (float)(~uVar21 & puVar6[3] & uVar40 | puVar2[3] & uVar40 & uVar21);
    if (pfVar9 != (float *)0x0) {
      fVar57 = (float)(uVar33 & (uint)fVar32 | uVar30 & (uint)fVar25);
      fVar58 = (float)(uVar34 & (uint)fVar32 | uVar19 & (uint)fVar25);
      fVar59 = (float)(uVar35 & (uint)fVar32 | uVar20 & (uint)fVar25);
      fVar60 = (float)(uVar36 & (uint)fVar32 | uVar21 & (uint)fVar25);
      fVar45 = (float)(uVar33 & (uint)(1.0 - fVar26) | uVar30 & (uint)fVar26);
      fVar46 = (float)(uVar34 & (uint)(1.0 - fVar26) | uVar19 & (uint)fVar26);
      fVar47 = (float)(uVar35 & (uint)(1.0 - fVar26) | uVar20 & (uint)fVar26);
      fVar48 = (float)(uVar36 & (uint)(1.0 - fVar26) | uVar21 & (uint)fVar26);
      pfVar3 = pfVar9 + uVar31;
      fVar22 = pfVar3[1];
      fVar23 = pfVar3[2];
      fVar24 = pfVar3[3];
      pfVar4 = pfVar9 + uVar31;
      *pfVar4 = (float)(~uVar37 & (uint)*pfVar3 |
                       (uint)(((1.0 - fVar57) - fVar45) * fVar41 + fVar57 * fVar53 + fVar45 * fVar49
                             ) & uVar37);
      pfVar4[1] = (float)(~uVar38 & (uint)fVar22 |
                         (uint)(((1.0 - fVar58) - fVar46) * fVar42 +
                               fVar58 * fVar54 + fVar46 * fVar50) & uVar38);
      pfVar4[2] = (float)(~uVar39 & (uint)fVar23 |
                         (uint)(((1.0 - fVar59) - fVar47) * fVar43 +
                               fVar59 * fVar55 + fVar47 * fVar51) & uVar39);
      pfVar4[3] = (float)(~uVar40 & (uint)fVar24 |
                         (uint)(((1.0 - fVar60) - fVar48) * fVar44 +
                               fVar60 * fVar56 + fVar48 * fVar52) & uVar40);
    }
    if (pfVar10 != (float *)0x0) {
      pfVar3 = pfVar10 + uVar31;
      fVar22 = pfVar3[1];
      fVar23 = pfVar3[2];
      fVar24 = pfVar3[3];
      pfVar4 = pfVar10 + uVar31;
      *pfVar4 = (float)(((uint)(fVar41 - fVar53) & uVar33 | (uint)(fVar53 - fVar41) & uVar30) &
                        uVar37 | ~uVar37 & (uint)*pfVar3);
      pfVar4[1] = (float)(((uint)(fVar42 - fVar54) & uVar34 | (uint)(fVar54 - fVar42) & uVar19) &
                          uVar38 | ~uVar38 & (uint)fVar22);
      pfVar4[2] = (float)(((uint)(fVar43 - fVar55) & uVar35 | (uint)(fVar55 - fVar43) & uVar20) &
                          uVar39 | ~uVar39 & (uint)fVar23);
      pfVar4[3] = (float)(((uint)(fVar44 - fVar56) & uVar36 | (uint)(fVar56 - fVar44) & uVar21) &
                          uVar40 | ~uVar40 & (uint)fVar24);
      pfVar3 = pfVar11 + uVar31;
      fVar53 = pfVar3[1];
      fVar54 = pfVar3[2];
      fVar55 = pfVar3[3];
      pfVar4 = pfVar11 + uVar31;
      *pfVar4 = (float)(~uVar37 & (uint)*pfVar3 |
                       ((uint)(fVar41 - fVar49) & uVar33 | (uint)(fVar49 - fVar41) & uVar30) &
                       uVar37);
      pfVar4[1] = (float)(~uVar38 & (uint)fVar53 |
                         ((uint)(fVar42 - fVar50) & uVar34 | (uint)(fVar50 - fVar42) & uVar19) &
                         uVar38);
      pfVar4[2] = (float)(~uVar39 & (uint)fVar54 |
                         ((uint)(fVar43 - fVar51) & uVar35 | (uint)(fVar51 - fVar43) & uVar20) &
                         uVar39);
      pfVar4[3] = (float)(~uVar40 & (uint)fVar55 |
                         ((uint)(fVar44 - fVar52) & uVar36 | (uint)(fVar52 - fVar44) & uVar21) &
                         uVar40);
    }
    if (pfVar12 != (float *)0x0) {
      pfVar3 = pfVar12 + uVar31;
      fVar41 = pfVar3[1];
      fVar42 = pfVar3[2];
      fVar43 = pfVar3[3];
      pfVar4 = pfVar12 + uVar31;
      *pfVar4 = (float)(~uVar37 & (uint)*pfVar3);
      pfVar4[1] = (float)(~uVar38 & (uint)fVar41);
      pfVar4[2] = (float)(~uVar39 & (uint)fVar42);
      pfVar4[3] = (float)(~uVar40 & (uint)fVar43);
      pfVar3 = pfVar13 + uVar31;
      fVar41 = pfVar3[1];
      fVar42 = pfVar3[2];
      fVar43 = pfVar3[3];
      pfVar4 = pfVar13 + uVar31;
      *pfVar4 = (float)(~uVar37 & (uint)*pfVar3);
      pfVar4[1] = (float)(~uVar38 & (uint)fVar41);
      pfVar4[2] = (float)(~uVar39 & (uint)fVar42);
      pfVar4[3] = (float)(~uVar40 & (uint)fVar43);
      pfVar3 = pfVar14 + uVar31;
      fVar41 = pfVar3[1];
      fVar42 = pfVar3[2];
      fVar43 = pfVar3[3];
      pfVar4 = pfVar14 + uVar31;
      *pfVar4 = (float)(~uVar37 & (uint)*pfVar3);
      pfVar4[1] = (float)(~uVar38 & (uint)fVar41);
      pfVar4[2] = (float)(~uVar39 & (uint)fVar42);
      pfVar4[3] = (float)(~uVar40 & (uint)fVar43);
    }
  }
  return;
}

Assistant:

void interpolate_impl(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      float v = args->v;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* dPdv = args->dPdv;
      float* ddPdudu = args->ddPdudu;
      float* ddPdvdv = args->ddPdvdv;
      float* ddPdudv = args->ddPdudv;
      unsigned int valueCount = args->valueCount;
      
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < numTimeSteps) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot <= vertexAttribs.size()));
      const char* src = nullptr; 
      size_t stride = 0;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
      } else {
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
      }
      
      for (unsigned int i=0; i<valueCount; i+=N)
      {
        const vbool<N> valid = vint<N>((int)i)+vint<N>(step) < vint<N>(int(valueCount));
        const size_t ofs = i*sizeof(float);
        const Quad& tri = quad(primID);
        const vfloat<N> p0 = mem<vfloat<N>>::loadu(valid,(float*)&src[tri.v[0]*stride+ofs]);
        const vfloat<N> p1 = mem<vfloat<N>>::loadu(valid,(float*)&src[tri.v[1]*stride+ofs]);
        const vfloat<N> p2 = mem<vfloat<N>>::loadu(valid,(float*)&src[tri.v[2]*stride+ofs]);
        const vfloat<N> p3 = mem<vfloat<N>>::loadu(valid,(float*)&src[tri.v[3]*stride+ofs]);      
        const vbool<N> left = u+v <= 1.0f;
        const vfloat<N> Q0 = select(left,p0,p2);
        const vfloat<N> Q1 = select(left,p1,p3);
        const vfloat<N> Q2 = select(left,p3,p1);
        const vfloat<N> U  = select(left,u,vfloat<N>(1.0f)-u);
        const vfloat<N> V  = select(left,v,vfloat<N>(1.0f)-v);
        const vfloat<N> W  = 1.0f-U-V;
        if (P) {
          mem<vfloat<N>>::storeu(valid,P+i,madd(W,Q0,madd(U,Q1,V*Q2)));
        }
        if (dPdu) { 
          assert(dPdu); mem<vfloat<N>>::storeu(valid,dPdu+i,select(left,Q1-Q0,Q0-Q1));
          assert(dPdv); mem<vfloat<N>>::storeu(valid,dPdv+i,select(left,Q2-Q0,Q0-Q2));
        }
        if (ddPdudu) { 
          assert(ddPdudu); mem<vfloat<N>>::storeu(valid,ddPdudu+i,vfloat<N>(zero));
          assert(ddPdvdv); mem<vfloat<N>>::storeu(valid,ddPdvdv+i,vfloat<N>(zero));
          assert(ddPdudv); mem<vfloat<N>>::storeu(valid,ddPdudv+i,vfloat<N>(zero));
        }
      }
    }